

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_widget_text(nk_command_buffer *o,nk_rect b,char *string,int len,nk_text *t,nk_flags a,
                   nk_user_font *f)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  nk_rect r;
  float local_78;
  float local_68;
  
  if (o == (nk_command_buffer *)0x0) {
    __assert_fail("o",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4a5e,
                  "void nk_widget_text(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_text *, nk_flags, const struct nk_user_font *)"
                 );
  }
  if (t != (nk_text *)0x0) {
    fVar3 = b.y;
    fVar7 = (t->padding).y;
    fVar4 = fVar7 + fVar7;
    fVar6 = fVar4;
    if (fVar4 <= b.h) {
      fVar6 = b.h;
    }
    fVar7 = fVar7 + fVar3;
    fVar1 = f->height;
    fVar8 = fVar1;
    if (fVar6 - fVar4 <= fVar1) {
      fVar8 = fVar6 - fVar4;
    }
    fVar1 = (*f->width)(f->userdata,fVar1,string,len);
    fVar4 = (t->padding).x;
    fVar5 = fVar4 + fVar4;
    local_78 = b.x;
    local_68 = b.w;
    if ((a & 1) == 0) {
      if ((a & 2) == 0) {
        if ((a & 4) == 0) {
          return;
        }
        fVar1 = fVar5 + fVar1 + fVar5;
        fVar9 = (local_68 + local_78) - fVar1;
        if (fVar9 <= fVar4 + local_78) {
          fVar9 = fVar4 + local_78;
        }
      }
      else {
        fVar2 = fVar1 + fVar5 + fVar5;
        if (fVar2 <= 1.0) {
          fVar2 = 1.0;
        }
        fVar4 = fVar4 + local_78;
        fVar9 = ((local_68 - fVar5) - fVar2) * 0.5 + fVar4;
        if (fVar9 <= fVar4) {
          fVar9 = fVar4;
        }
        fVar1 = local_78 + local_68;
        if (fVar2 + fVar9 <= local_78 + local_68) {
          fVar1 = fVar2 + fVar9;
        }
        if (fVar9 <= fVar1) {
          fVar1 = fVar1 - fVar9;
        }
      }
    }
    else {
      fVar1 = local_68 - fVar5;
      fVar9 = fVar4 + local_78;
      if (local_68 - fVar5 <= 0.0) {
        fVar1 = 0.0;
      }
    }
    if ((a & 0x10) == 0) {
      if ((a & 0x20) != 0) {
        fVar7 = (fVar3 + fVar6) - f->height;
        fVar8 = f->height;
      }
    }
    else {
      fVar5 = fVar6 * 0.5;
      fVar4 = f->height * 0.5;
      fVar7 = (fVar3 + fVar5) - fVar4;
      fVar8 = fVar6 - (fVar4 + fVar5);
      if (fVar8 <= fVar5) {
        fVar8 = fVar5;
      }
    }
    r.y = fVar7;
    r.x = fVar9;
    r.h = fVar8;
    r.w = fVar1;
    nk_draw_text(o,r,string,len,f,t->background,t->text);
    return;
  }
  __assert_fail("t",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x4a5f,
                "void nk_widget_text(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_text *, nk_flags, const struct nk_user_font *)"
               );
}

Assistant:

NK_LIB void
nk_widget_text(struct nk_command_buffer *o, struct nk_rect b,
    const char *string, int len, const struct nk_text *t,
    nk_flags a, const struct nk_user_font *f)
{
    struct nk_rect label;
    float text_width;

    NK_ASSERT(o);
    NK_ASSERT(t);
    if (!o || !t) return;

    b.h = NK_MAX(b.h, 2 * t->padding.y);
    label.x = 0; label.w = 0;
    label.y = b.y + t->padding.y;
    label.h = NK_MIN(f->height, b.h - 2 * t->padding.y);

    text_width = f->width(f->userdata, f->height, (const char*)string, len);
    text_width += (2.0f * t->padding.x);

    /* align in x-axis */
    if (a & NK_TEXT_ALIGN_LEFT) {
        label.x = b.x + t->padding.x;
        label.w = NK_MAX(0, b.w - 2 * t->padding.x);
    } else if (a & NK_TEXT_ALIGN_CENTERED) {
        label.w = NK_MAX(1, 2 * t->padding.x + (float)text_width);
        label.x = (b.x + t->padding.x + ((b.w - 2 * t->padding.x) - label.w) / 2);
        label.x = NK_MAX(b.x + t->padding.x, label.x);
        label.w = NK_MIN(b.x + b.w, label.x + label.w);
        if (label.w >= label.x) label.w -= label.x;
    } else if (a & NK_TEXT_ALIGN_RIGHT) {
        label.x = NK_MAX(b.x + t->padding.x, (b.x + b.w) - (2 * t->padding.x + (float)text_width));
        label.w = (float)text_width + 2 * t->padding.x;
    } else return;

    /* align in y-axis */
    if (a & NK_TEXT_ALIGN_MIDDLE) {
        label.y = b.y + b.h/2.0f - (float)f->height/2.0f;
        label.h = NK_MAX(b.h/2.0f, b.h - (b.h/2.0f + f->height/2.0f));
    } else if (a & NK_TEXT_ALIGN_BOTTOM) {
        label.y = b.y + b.h - f->height;
        label.h = f->height;
    }
    nk_draw_text(o, label, (const char*)string, len, f, t->background, t->text);
}